

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void __thiscall
Fossilize::FeatureFilter::Impl::unregister_shader_module_info(Impl *this,VkShaderModule module)

{
  bool bVar1;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
  local_30;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
  local_28;
  iterator itr;
  lock_guard<std::mutex> holder;
  VkShaderModule module_local;
  Impl *this_local;
  
  holder._M_device = (mutex_type *)module;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->module_to_info_lock)
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModule_T_*,_Fossilize::FeatureFilter::Impl::ModuleInfo,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>_>
       ::find(&this->module_to_info,(key_type *)&holder);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModule_T_*,_Fossilize::FeatureFilter::Impl::ModuleInfo,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>_>
       ::end(&this->module_to_info);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::
    unordered_map<VkShaderModule_T_*,_Fossilize::FeatureFilter::Impl::ModuleInfo,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>_>
    ::erase(&this->module_to_info,(iterator)local_28._M_cur);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return;
}

Assistant:

void FeatureFilter::Impl::unregister_shader_module_info(VkShaderModule module)
{
	std::lock_guard<std::mutex> holder{module_to_info_lock};
	auto itr = module_to_info.find(module);
	if (itr != module_to_info.end())
		module_to_info.erase(itr);
}